

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQObject __thiscall SQFuncState::CreateTable(SQFuncState *this)

{
  SQTable *pSVar1;
  SQObject SVar2;
  SQObjectPtr local_40;
  undefined1 auStack_30 [8];
  SQObjectPtr nt;
  SQFuncState *this_local;
  
  nt.super_SQObject._unVal = (SQObjectValue)this;
  pSVar1 = SQTable::Create(this->_sharedstate,0);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)auStack_30,pSVar1);
  pSVar1 = (this->_strings).super_SQObject._unVal.pTable;
  ::SQObjectPtr::SQObjectPtr(&local_40,1);
  SQTable::NewSlot(pSVar1,(SQObjectPtr *)auStack_30,&local_40);
  ::SQObjectPtr::~SQObjectPtr(&local_40);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)auStack_30);
  SVar2._0_8_ = (ulong)auStack_30 & 0xffffffff;
  SVar2._unVal = (SQObjectValue)nt.super_SQObject._0_8_;
  return SVar2;
}

Assistant:

SQObject SQFuncState::CreateTable()
{
    SQObjectPtr nt(SQTable::Create(_sharedstate,0));
    _table(_strings)->NewSlot(nt,(SQInteger)1);
    return nt;
}